

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

void CSOAA::output_rank_example(vw *all,example *head_ec,bool *hit_loss,multi_ex *ec_seq)

{
  uint64_t *puVar1;
  v_array<char> *pvVar2;
  polyprediction *a_s;
  wclass *pwVar3;
  wclass *pwVar4;
  pointer ppeVar5;
  int *piVar6;
  _func_void_int_string_v_array<char> *p_Var7;
  v_array<char> vVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  pointer ppeVar12;
  ostream *poVar13;
  ulong uVar14;
  int *piVar15;
  long lVar16;
  float *pfVar17;
  float fVar18;
  vw *pvVar19;
  polylabel *ppVar20;
  string local_1f8 [32];
  string outputString;
  stringstream outputStringStream;
  ostream local_1a8;
  
  pwVar3 = (head_ec->l).cs.costs._begin;
  pwVar4 = (head_ec->l).cs.costs._end;
  iVar11 = example_is_newline(head_ec);
  if (iVar11 == 0) {
    bVar9 = ec_is_label_definition(head_ec);
    if (!bVar9) {
      puVar1 = &all->sd->total_features;
      *puVar1 = *puVar1 + head_ec->num_features;
      ppVar20 = &head_ec->l;
      a_s = &head_ec->pred;
      cVar10 = (*(code *)PTR_test_label_002b2b00)();
      if (cVar10 == '\0') {
        ppeVar12 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppeVar5 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        fVar18 = 0.0;
        uVar14 = 0;
        while ((ppeVar12 != ppeVar5 && (*hit_loss == false))) {
          if (uVar14 == ((a_s->a_s)._begin)->action) {
            fVar18 = (((*ppeVar12)->l).cs.costs._begin)->x;
            *hit_loss = true;
          }
          uVar14 = uVar14 + 1;
          ppeVar12 = ppeVar12 + 1;
        }
        all->sd->sum_loss = all->sd->sum_loss + (double)fVar18;
        all->sd->sum_loss_since_last_dump = (double)fVar18 + all->sd->sum_loss_since_last_dump;
      }
      piVar6 = (all->final_prediction_sink)._end;
      pvVar2 = &head_ec->tag;
      for (piVar15 = (all->final_prediction_sink)._begin; piVar15 != piVar6; piVar15 = piVar15 + 1)
      {
        ACTION_SCORE::print_action_score
                  (*piVar15,(v_array<ACTION_SCORE::action_score> *)&a_s->scalars,pvVar2);
      }
      if (0 < all->raw_prediction) {
        outputString._M_dataplus._M_p = (pointer)&outputString.field_2;
        outputString._M_string_length = 0;
        outputString.field_2._M_local_buf[0] = '\0';
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&outputStringStream,(string *)&outputString,_S_out|_S_in);
        pfVar17 = &pwVar3->partial_prediction;
        for (lVar16 = 0; (long)pwVar4 - (long)pwVar3 >> 4 != lVar16; lVar16 = lVar16 + 1) {
          if (lVar16 != 0) {
            std::operator<<(&local_1a8,' ');
          }
          poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          poVar13 = std::operator<<(poVar13,':');
          std::ostream::operator<<(poVar13,*pfVar17);
          pfVar17 = pfVar17 + 4;
        }
        p_Var7 = all->print_text;
        iVar11 = all->raw_prediction;
        pvVar19 = all;
        std::__cxx11::stringbuf::str();
        vVar8._end = (char *)head_ec;
        vVar8._begin = (char *)pvVar19;
        vVar8.end_array = (char *)ec_seq;
        vVar8.erase_count = (size_t)ppVar20;
        (*p_Var7)(iVar11,(string)*pvVar2,vVar8);
        std::__cxx11::string::~string(local_1f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
        std::__cxx11::string::~string((string *)&outputString);
      }
      bVar9 = (bool)(*(code *)PTR_test_label_002b2b00)(ppVar20);
      COST_SENSITIVE::print_update(all,bVar9,head_ec,ec_seq,true,0);
    }
  }
  return;
}

Assistant:

void output_rank_example(vw& all, example& head_ec, bool& hit_loss, multi_ex* ec_seq)
{
  label& ld = head_ec.l.cs;
  v_array<COST_SENSITIVE::wclass> costs = ld.costs;

  if (example_is_newline(head_ec))
    return;
  if (ec_is_label_definition(head_ec))
    return;

  all.sd->total_features += head_ec.num_features;

  float loss = 0.;
  v_array<action_score>& preds = head_ec.pred.a_s;

  if (!COST_SENSITIVE::cs_label.test_label(&head_ec.l))
  {
    size_t idx = 0;
    for (example* ex : *ec_seq)
    {
      if (hit_loss)
        break;
      if (preds[0].action == idx)
      {
        loss = ex->l.cs.costs[0].x;
        hit_loss = true;
      }
      idx++;
    }
    all.sd->sum_loss += loss;
    all.sd->sum_loss_since_last_dump += loss;
    assert(loss >= 0);
  }

  for (int sink : all.final_prediction_sink) print_action_score(sink, head_ec.pred.a_s, head_ec.tag);

  if (all.raw_prediction > 0)
  {
    string outputString;
    stringstream outputStringStream(outputString);
    for (size_t i = 0; i < costs.size(); i++)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << costs[i].class_index << ':' << costs[i].partial_prediction;
    }
    // outputStringStream << endl;
    all.print_text(all.raw_prediction, outputStringStream.str(), head_ec.tag);
  }

  COST_SENSITIVE::print_update(all, COST_SENSITIVE::cs_label.test_label(&head_ec.l), head_ec, ec_seq, true, 0);
}